

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::compareGenMipmapVeryLenient
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  deInt32 dVar10;
  deInt32 dVar11;
  Vec4 local_e4;
  Vector<bool,_4> local_d4;
  Vector<bool,_4> local_d0;
  Vector<bool,_4> local_cc;
  TextureFormat local_c8;
  float local_c0 [2];
  tcu local_b8 [16];
  undefined1 local_a8 [8];
  Vec4 sample;
  int sy;
  int sx;
  int kx;
  int ky;
  ChannelType CStack_80;
  bool isOk;
  Vec4 maxVal;
  Vec4 minVal;
  int maxY;
  int maxX;
  int minY;
  int minX;
  Vec4 result;
  int x;
  int y;
  int numFailed;
  float srcH;
  float srcW;
  float dstH;
  float dstW;
  GenMipmapPrecision *precision_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *src_local;
  ConstPixelBufferAccess *dst_local;
  
  iVar3 = tcu::ConstPixelBufferAccess::getWidth(dst);
  iVar4 = tcu::ConstPixelBufferAccess::getHeight(dst);
  iVar5 = tcu::ConstPixelBufferAccess::getWidth(src);
  iVar6 = tcu::ConstPixelBufferAccess::getHeight(src);
  x = 0;
  for (result.m_data[3] = 0.0; fVar1 = result.m_data[3],
      iVar7 = tcu::ConstPixelBufferAccess::getHeight(dst), (int)fVar1 < iVar7;
      result.m_data[3] = (float)((int)result.m_data[3] + 1)) {
    for (result.m_data[2] = 0.0; fVar1 = result.m_data[2],
        iVar7 = tcu::ConstPixelBufferAccess::getWidth(dst), (int)fVar1 < iVar7;
        result.m_data[2] = (float)((int)result.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&minY,(int)dst,(int)result.m_data[2],
                 (int)result.m_data[3]);
      dVar8 = ::deFloorFloatToInt32
                        ((((float)(int)result.m_data[2] - 0.5) / (float)iVar3) * (float)iVar5);
      dVar9 = ::deFloorFloatToInt32
                        ((((float)(int)result.m_data[3] - 0.5) / (float)iVar4) * (float)iVar6);
      dVar10 = ::deCeilFloatToInt32
                         ((((float)(int)result.m_data[2] + 1.5) / (float)iVar3) * (float)iVar5);
      dVar11 = ::deCeilFloatToInt32
                         ((((float)(int)result.m_data[3] + 1.5) / (float)iVar4) * (float)iVar6);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(maxVal.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&ky);
      for (sx = dVar9; sy = dVar8, sx <= dVar11; sx = sx + 1) {
        for (; sy <= dVar10; sy = sy + 1) {
          iVar7 = tcu::ConstPixelBufferAccess::getWidth(src);
          sample.m_data[3] = (float)de::clamp<int>(sy,0,iVar7 + -1);
          iVar7 = tcu::ConstPixelBufferAccess::getHeight(src);
          sample.m_data[2] = (float)de::clamp<int>(sx,0,iVar7 + -1);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_a8,(int)src,(int)sample.m_data[3],
                     (int)sample.m_data[2]);
          if ((sx == dVar9) && (sy == dVar8)) {
            maxVal.m_data[2] = (float)local_a8._0_4_;
            maxVal.m_data[3] = (float)local_a8._4_4_;
            ky = local_a8._0_4_;
            CStack_80 = local_a8._4_4_;
            maxVal.m_data[0] = sample.m_data[0];
            maxVal.m_data[1] = sample.m_data[1];
          }
          else {
            tcu::min<float,4>(local_b8,(Vector<float,_4> *)local_a8,
                              (Vector<float,_4> *)(maxVal.m_data + 2));
            maxVal.m_data._8_8_ = local_b8._0_8_;
            tcu::max<float,4>((tcu *)&local_c8,(Vector<float,_4> *)local_a8,(Vector<float,_4> *)&ky)
            ;
            _ky = local_c8;
            maxVal.m_data[0] = local_c0[0];
            maxVal.m_data[1] = local_c0[1];
          }
        }
      }
      tcu::lessThanEqual<float,4>
                ((tcu *)&local_d0,(Vector<float,_4> *)(maxVal.m_data + 2),(Vector<float,_4> *)&minY)
      ;
      tcu::lessThanEqual<float,4>
                ((tcu *)&local_d4,(Vector<float,_4> *)&minY,(Vector<float,_4> *)&ky);
      tcu::logicalAnd<bool,4>((tcu *)&local_cc,&local_d0,&local_d4);
      bVar2 = tcu::boolAll<4>(&local_cc);
      if (bVar2) {
        tcu::RGBA::green();
        tcu::RGBA::toVec((RGBA *)&local_e4);
      }
      else {
        tcu::RGBA::red();
        tcu::RGBA::toVec((RGBA *)&local_e4);
      }
      tcu::PixelBufferAccess::setPixel
                (errorMask,&local_e4,(int)result.m_data[2],(int)result.m_data[3],0);
      if (!bVar2) {
        x = x + 1;
      }
    }
  }
  return x;
}

Assistant:

static int compareGenMipmapVeryLenient (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.
	DE_UNREF(precision);

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const int		minX		= deFloorFloatToInt32(((float)x-0.5f) / dstW * srcW);
		const int		minY		= deFloorFloatToInt32(((float)y-0.5f) / dstH * srcH);
		const int		maxX		= deCeilFloatToInt32(((float)x+1.5f) / dstW * srcW);
		const int		maxY		= deCeilFloatToInt32(((float)y+1.5f) / dstH * srcH);
		tcu::Vec4		minVal, maxVal;
		bool			isOk;

		DE_ASSERT(minX < maxX && minY < maxY);

		for (int ky = minY; ky <= maxY; ky++)
		{
			for (int kx = minX; kx <= maxX; kx++)
			{
				const int		sx		= de::clamp(kx, 0, src.getWidth()-1);
				const int		sy		= de::clamp(ky, 0, src.getHeight()-1);
				const tcu::Vec4	sample	= src.getPixel(sx, sy);

				if (ky == minY && kx == minX)
				{
					minVal = sample;
					maxVal = sample;
				}
				else
				{
					minVal = min(sample, minVal);
					maxVal = max(sample, maxVal);
				}
			}
		}

		isOk = boolAll(logicalAnd(lessThanEqual(minVal, result), lessThanEqual(result, maxVal)));

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}